

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QRVersion.cpp
# Opt level: O2

Version * ZXing::QRCode::Version::Model1(int number)

{
  int iVar1;
  Version *pVVar2;
  long lVar3;
  int *piVar4;
  undefined4 *puVar5;
  array<ZXing::QRCode::ECBlocks,_4UL> *paVar6;
  byte bVar7;
  array<ZXing::QRCode::ECBlocks,_4UL> aStack_488;
  array<ZXing::QRCode::ECBlocks,_4UL> local_438;
  array<ZXing::QRCode::ECBlocks,_4UL> local_3e8;
  array<ZXing::QRCode::ECBlocks,_4UL> local_398;
  array<ZXing::QRCode::ECBlocks,_4UL> local_348;
  array<ZXing::QRCode::ECBlocks,_4UL> local_2f8;
  array<ZXing::QRCode::ECBlocks,_4UL> local_2a8;
  array<ZXing::QRCode::ECBlocks,_4UL> local_258;
  array<ZXing::QRCode::ECBlocks,_4UL> local_208;
  array<ZXing::QRCode::ECBlocks,_4UL> local_1b8;
  array<ZXing::QRCode::ECBlocks,_4UL> local_168;
  array<ZXing::QRCode::ECBlocks,_4UL> local_118;
  array<ZXing::QRCode::ECBlocks,_4UL> local_c8;
  array<ZXing::QRCode::ECBlocks,_4UL> local_78;
  
  bVar7 = 0;
  if (Model1(int)::allVersions == '\0') {
    iVar1 = __cxa_guard_acquire(&Model1(int)::allVersions);
    if (iVar1 != 0) {
      piVar4 = &DAT_001a8acc;
      paVar6 = &local_78;
      for (lVar3 = 0x14; lVar3 != 0; lVar3 = lVar3 + -1) {
        paVar6->_M_elems[0].codewordsPerBlock = *piVar4;
        piVar4 = piVar4 + (ulong)bVar7 * -2 + 1;
        paVar6 = (array<ZXing::QRCode::ECBlocks,_4UL> *)((long)paVar6 + (ulong)bVar7 * -8 + 4);
      }
      Version(Model1::allVersions,1,&local_78);
      piVar4 = &DAT_001a8b1c;
      paVar6 = &local_c8;
      for (lVar3 = 0x14; lVar3 != 0; lVar3 = lVar3 + -1) {
        paVar6->_M_elems[0].codewordsPerBlock = *piVar4;
        piVar4 = piVar4 + (ulong)bVar7 * -2 + 1;
        paVar6 = (array<ZXing::QRCode::ECBlocks,_4UL> *)((long)paVar6 + (ulong)bVar7 * -8 + 4);
      }
      Version(Model1::allVersions + 1,2,&local_c8);
      piVar4 = &DAT_001a8b6c;
      paVar6 = &local_118;
      for (lVar3 = 0x14; lVar3 != 0; lVar3 = lVar3 + -1) {
        paVar6->_M_elems[0].codewordsPerBlock = *piVar4;
        piVar4 = piVar4 + (ulong)bVar7 * -2 + 1;
        paVar6 = (array<ZXing::QRCode::ECBlocks,_4UL> *)((long)paVar6 + (ulong)bVar7 * -8 + 4);
      }
      Version(Model1::allVersions + 2,3,&local_118);
      piVar4 = &DAT_001a8bbc;
      paVar6 = &local_168;
      for (lVar3 = 0x14; lVar3 != 0; lVar3 = lVar3 + -1) {
        paVar6->_M_elems[0].codewordsPerBlock = *piVar4;
        piVar4 = piVar4 + (ulong)bVar7 * -2 + 1;
        paVar6 = (array<ZXing::QRCode::ECBlocks,_4UL> *)((long)paVar6 + (ulong)bVar7 * -8 + 4);
      }
      Version(Model1::allVersions + 3,4,&local_168);
      piVar4 = &DAT_001a8c0c;
      paVar6 = &local_1b8;
      for (lVar3 = 0x14; lVar3 != 0; lVar3 = lVar3 + -1) {
        paVar6->_M_elems[0].codewordsPerBlock = *piVar4;
        piVar4 = piVar4 + (ulong)bVar7 * -2 + 1;
        paVar6 = (array<ZXing::QRCode::ECBlocks,_4UL> *)((long)paVar6 + (ulong)bVar7 * -8 + 4);
      }
      Version(Model1::allVersions + 4,5,&local_1b8);
      piVar4 = &DAT_001a8c5c;
      paVar6 = &local_208;
      for (lVar3 = 0x14; lVar3 != 0; lVar3 = lVar3 + -1) {
        paVar6->_M_elems[0].codewordsPerBlock = *piVar4;
        piVar4 = piVar4 + (ulong)bVar7 * -2 + 1;
        paVar6 = (array<ZXing::QRCode::ECBlocks,_4UL> *)((long)paVar6 + (ulong)bVar7 * -8 + 4);
      }
      Version(Model1::allVersions + 5,6,&local_208);
      piVar4 = &DAT_001a8cac;
      paVar6 = &local_258;
      for (lVar3 = 0x14; lVar3 != 0; lVar3 = lVar3 + -1) {
        paVar6->_M_elems[0].codewordsPerBlock = *piVar4;
        piVar4 = piVar4 + (ulong)bVar7 * -2 + 1;
        paVar6 = (array<ZXing::QRCode::ECBlocks,_4UL> *)((long)paVar6 + (ulong)bVar7 * -8 + 4);
      }
      Version(Model1::allVersions + 6,7,&local_258);
      piVar4 = &DAT_001a8cfc;
      paVar6 = &local_2a8;
      for (lVar3 = 0x14; lVar3 != 0; lVar3 = lVar3 + -1) {
        paVar6->_M_elems[0].codewordsPerBlock = *piVar4;
        piVar4 = piVar4 + (ulong)bVar7 * -2 + 1;
        paVar6 = (array<ZXing::QRCode::ECBlocks,_4UL> *)((long)paVar6 + (ulong)bVar7 * -8 + 4);
      }
      Version(Model1::allVersions + 7,8,&local_2a8);
      piVar4 = &DAT_001a8d4c;
      paVar6 = &local_2f8;
      for (lVar3 = 0x14; lVar3 != 0; lVar3 = lVar3 + -1) {
        paVar6->_M_elems[0].codewordsPerBlock = *piVar4;
        piVar4 = piVar4 + (ulong)bVar7 * -2 + 1;
        paVar6 = (array<ZXing::QRCode::ECBlocks,_4UL> *)((long)paVar6 + (ulong)bVar7 * -8 + 4);
      }
      Version(Model1::allVersions + 8,9,&local_2f8);
      piVar4 = &DAT_001a8d9c;
      paVar6 = &local_348;
      for (lVar3 = 0x14; lVar3 != 0; lVar3 = lVar3 + -1) {
        paVar6->_M_elems[0].codewordsPerBlock = *piVar4;
        piVar4 = piVar4 + (ulong)bVar7 * -2 + 1;
        paVar6 = (array<ZXing::QRCode::ECBlocks,_4UL> *)((long)paVar6 + (ulong)bVar7 * -8 + 4);
      }
      Version(Model1::allVersions + 9,10,&local_348);
      piVar4 = &DAT_001a8dec;
      paVar6 = &local_398;
      for (lVar3 = 0x14; lVar3 != 0; lVar3 = lVar3 + -1) {
        paVar6->_M_elems[0].codewordsPerBlock = *piVar4;
        piVar4 = piVar4 + (ulong)bVar7 * -2 + 1;
        paVar6 = (array<ZXing::QRCode::ECBlocks,_4UL> *)((long)paVar6 + (ulong)bVar7 * -8 + 4);
      }
      Version(Model1::allVersions + 10,0xb,&local_398);
      piVar4 = &DAT_001a8e3c;
      paVar6 = &local_3e8;
      for (lVar3 = 0x14; lVar3 != 0; lVar3 = lVar3 + -1) {
        paVar6->_M_elems[0].codewordsPerBlock = *piVar4;
        piVar4 = piVar4 + (ulong)bVar7 * -2 + 1;
        paVar6 = (array<ZXing::QRCode::ECBlocks,_4UL> *)((long)paVar6 + (ulong)bVar7 * -8 + 4);
      }
      Version(Model1::allVersions + 0xb,0xc,&local_3e8);
      piVar4 = &DAT_001a8e8c;
      paVar6 = &local_438;
      for (lVar3 = 0x14; lVar3 != 0; lVar3 = lVar3 + -1) {
        paVar6->_M_elems[0].codewordsPerBlock = *piVar4;
        piVar4 = piVar4 + (ulong)bVar7 * -2 + 1;
        paVar6 = (array<ZXing::QRCode::ECBlocks,_4UL> *)((long)paVar6 + (ulong)bVar7 * -8 + 4);
      }
      Version(Model1::allVersions + 0xc,0xd,&local_438);
      puVar5 = &DAT_001a8edc;
      paVar6 = &aStack_488;
      for (lVar3 = 0x14; lVar3 != 0; lVar3 = lVar3 + -1) {
        *(undefined4 *)paVar6 = *puVar5;
        puVar5 = puVar5 + (ulong)bVar7 * -2 + 1;
        paVar6 = (array<ZXing::QRCode::ECBlocks,_4UL> *)((long)paVar6 + ((ulong)bVar7 * -2 + 1) * 4)
        ;
      }
      Version(Model1::allVersions + 0xd,0xe,&aStack_488);
      __cxa_atexit(__cxx_global_array_dtor_112,0,&__dso_handle);
      __cxa_guard_release(&Model1(int)::allVersions);
    }
  }
  pVVar2 = (Version *)0x0;
  if (0xfffffff1 < number - 0xfU) {
    pVVar2 = (Version *)
             &rMQR::allVersions[(ulong)(uint)number + 0x1f]._alignmentPatternCenters.
              super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
              _M_finish;
  }
  return pVVar2;
}

Assistant:

const Version* Version::Model1(int number)
{
	/**
	 * See ISO 18004:2000 M.4.2 Table M.2
	 * See ISO 18004:2000 M.5 Table M.4
	 */
	static const Version allVersions[] = {
		{1, {
			7 , 1, 19, 0, 0,
			10, 1, 16, 0, 0,
			13, 1, 13, 0, 0,
			17, 1, 9 , 0, 0
			}},
		{2, {
			10, 1, 36, 0, 0,
			16, 1, 30, 0, 0,
			22, 1, 24, 0, 0,
			30, 1, 16, 0, 0,
			}},
		{3, {
			15, 1, 57, 0, 0,
			28, 1, 44, 0, 0,
			36, 1, 36, 0, 0,
			48, 1, 24, 0, 0,
			}},
		{4, {
			20, 1, 80, 0, 0,
			40, 1, 60, 0, 0,
			50, 1, 50, 0, 0,
			66, 1, 34, 0, 0,
			}},
		{5, {
			26, 1, 108, 0, 0,
			52, 1, 82 , 0, 0,
			66, 1, 68 , 0, 0,
			44, 2, 23 , 0, 0,
			}},
		{6, {
			34, 1, 136, 0, 0,
			32, 2, 53 , 0, 0,
			42, 2, 43 , 0, 0,
			56, 2, 29 , 0, 0,
			}},
		{7, {
			42, 1, 170, 0, 0,
			40, 2, 66 , 0, 0,
			52, 2, 54 , 0, 0,
			46, 3, 24 , 0, 0,
			}},
		{8, {
			24, 2, 104, 0, 0,
			48, 2, 80 , 0, 0,
			64, 2, 64 , 0, 0,
			56, 3, 29 , 0, 0,
			}},
		{9, {
			30, 2, 123, 0, 0,
			60, 2, 93 , 0, 0,
			50, 3, 52 , 0, 0,
			68, 3, 34 , 0, 0,
			}},
		{10, {
			34, 2, 145, 0, 0,
			68, 2, 111, 0, 0,
			58, 3, 61 , 0, 0,
			58, 4, 31 , 0, 0,
			}},
		{11, {
			40, 2, 168, 0, 0,
			40, 4, 64 , 0, 0,
			52, 4, 52 , 0, 0,
			54, 5, 29 , 0, 0,
			}},
		{12, {
			46, 2, 192, 0, 0,
			46, 4, 73 , 0, 0,
			58, 4, 61 , 0, 0,
			62, 5, 33 , 0, 0,
			}},
		{13, {
			36, 3, 144, 0, 0,
			52, 4, 83 , 0, 0,
			66, 4, 69 , 0, 0,
			58, 6, 32 , 0, 0,
			}},
		{14, {
			40, 3, 163, 0, 0,
			60, 4, 92 , 0, 0,
			60, 5, 62 , 0, 0,
			66, 6, 35 , 0, 0,
			}},
	};

	if (number < 1 || number > 14)
		return nullptr;
	return allVersions + number - 1;
}